

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O0

QRect QStyle::alignedRect(LayoutDirection direction,Alignment alignment,QSize *size,QRect *rectangle
                         )

{
  long lVar1;
  QRect QVar2;
  bool bVar3;
  long in_FS_OFFSET;
  int h;
  int w;
  int y;
  int x;
  int in_stack_ffffffffffffff68;
  AlignmentFlag in_stack_ffffffffffffff6c;
  LayoutDirection in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  visualAlignment(in_stack_ffffffffffffff70,(Alignment)in_stack_ffffffffffffff7c.i);
  QRect::x((QRect *)0x40aa19);
  QRect::y((QRect *)0x40aa27);
  QSize::width((QSize *)0x40aa35);
  QSize::height((QSize *)0x40aa43);
  QFlags<Qt::AlignmentFlag>::operator&
            ((QFlags<Qt::AlignmentFlag> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
            );
  bVar3 = ::operator==((QFlags<Qt::AlignmentFlag>)in_stack_ffffffffffffff7c.i,
                       in_stack_ffffffffffffff70);
  if (bVar3) {
    QRect::size((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    in_stack_ffffffffffffff84 = QSize::height((QSize *)0x40aa87);
    in_stack_ffffffffffffff84 = in_stack_ffffffffffffff84 / 2;
  }
  else {
    QFlags<Qt::AlignmentFlag>::operator&
              ((QFlags<Qt::AlignmentFlag> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
    bVar3 = ::operator==((QFlags<Qt::AlignmentFlag>)in_stack_ffffffffffffff7c.i,
                         in_stack_ffffffffffffff70);
    if (bVar3) {
      QRect::size((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      QSize::height((QSize *)0x40aaf1);
    }
  }
  QFlags<Qt::AlignmentFlag>::operator&
            ((QFlags<Qt::AlignmentFlag> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
            );
  bVar3 = ::operator==((QFlags<Qt::AlignmentFlag>)in_stack_ffffffffffffff7c.i,
                       in_stack_ffffffffffffff70);
  if (bVar3) {
    QRect::size((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    QSize::width((QSize *)0x40ab3f);
  }
  else {
    QFlags<Qt::AlignmentFlag>::operator&
              ((QFlags<Qt::AlignmentFlag> *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
    bVar3 = ::operator==((QFlags<Qt::AlignmentFlag>)in_stack_ffffffffffffff7c.i,
                         in_stack_ffffffffffffff70);
    if (bVar3) {
      QRect::size((QRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      QSize::width((QSize *)0x40ab8d);
    }
  }
  QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff7c.i,in_stack_ffffffffffffff78),
               in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  QVar2.x2.m_i = (int)local_10;
  QVar2._0_8_ = local_18;
  QVar2.y2.m_i = (int)((ulong)local_10 >> 0x20);
  return QVar2;
}

Assistant:

QRect QStyle::alignedRect(Qt::LayoutDirection direction, Qt::Alignment alignment, const QSize &size, const QRect &rectangle)
{
    alignment = visualAlignment(direction, alignment);
    int x = rectangle.x();
    int y = rectangle.y();
    int w = size.width();
    int h = size.height();
    if ((alignment & Qt::AlignVCenter) == Qt::AlignVCenter)
        y += rectangle.size().height()/2 - h/2;
    else if ((alignment & Qt::AlignBottom) == Qt::AlignBottom)
        y += rectangle.size().height() - h;
    if ((alignment & Qt::AlignRight) == Qt::AlignRight)
        x += rectangle.size().width() - w;
    else if ((alignment & Qt::AlignHCenter) == Qt::AlignHCenter)
        x += rectangle.size().width()/2 - w/2;
    return QRect(x, y, w, h);
}